

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexcmp.cpp
# Opt level: O0

UnicodeSet * __thiscall icu_63::RegexCompile::scanPosixProp(RegexCompile *this)

{
  UBool UVar1;
  UBool UVar2;
  UChar32 UVar3;
  UChar32 UVar4;
  int64_t iVar5;
  int64_t iVar6;
  int64_t iVar7;
  UBool UVar8;
  long lVar9;
  bool negated_00;
  bool bVar10;
  long local_c8;
  int64_t __offset;
  UBool sawPropSetTerminator;
  undefined1 local_98 [7];
  UBool negated;
  UnicodeString propName;
  RegexPatternChar savedfC;
  UChar32 savedPeekChar;
  UChar32 savedLastChar;
  int64_t savedCharNum;
  int64_t savedLineNum;
  UBool savedEOLComments;
  UBool savedInBackslashQuote;
  UBool savedQuoteMode;
  int64_t savedNextIndex;
  int64_t savedScanIndex;
  UnicodeSet *uset;
  RegexCompile *this_local;
  
  savedScanIndex = 0;
  UVar8 = ::U_FAILURE(*this->fStatus);
  if (UVar8 == '\0') {
    iVar5 = this->fScanIndex;
    if (this->fRXPat->fPattern->nativeIndexingLimit < this->fRXPat->fPattern->chunkOffset) {
      local_c8 = (*this->fRXPat->fPattern->pFuncs->mapOffsetToNative)(this->fRXPat->fPattern);
    }
    else {
      local_c8 = this->fRXPat->fPattern->chunkNativeStart +
                 (long)this->fRXPat->fPattern->chunkOffset;
    }
    UVar8 = this->fQuoteMode;
    UVar1 = this->fInBackslashQuote;
    UVar2 = this->fEOLComments;
    iVar6 = this->fLineNum;
    iVar7 = this->fCharNum;
    UVar3 = this->fLastChar;
    UVar4 = this->fPeekChar;
    propName.fUnion._48_8_ = this->fC;
    UnicodeString::UnicodeString((UnicodeString *)local_98);
    nextChar(this,&this->fC);
    negated_00 = (this->fC).fChar == 0x5e;
    if (negated_00) {
      nextChar(this,&this->fC);
    }
    bVar10 = false;
    do {
      UnicodeString::append((UnicodeString *)local_98,(this->fC).fChar);
      nextChar(this,&this->fC);
      if (((this->fC).fQuoted != '\0') || ((this->fC).fChar == -1)) goto LAB_001881a1;
    } while ((this->fC).fChar != 0x3a);
    nextChar(this,&this->fC);
    bVar10 = (this->fC).fChar == 0x5d;
LAB_001881a1:
    if (bVar10) {
      savedScanIndex = (int64_t)createSetForProperty(this,(UnicodeString *)local_98,negated_00);
    }
    else {
      this->fScanIndex = iVar5;
      this->fQuoteMode = UVar8;
      this->fInBackslashQuote = UVar1;
      this->fEOLComments = UVar2;
      this->fLineNum = iVar6;
      this->fCharNum = iVar7;
      this->fLastChar = UVar3;
      this->fPeekChar = UVar4;
      (this->fC).fChar = propName.fUnion._48_4_;
      (this->fC).fQuoted = propName.fUnion._52_1_;
      *(undefined3 *)&(this->fC).field_0x5 = propName.fUnion._53_3_;
      lVar9 = local_c8 - this->fRXPat->fPattern->chunkNativeStart;
      if (((lVar9 < 0) || (this->fRXPat->fPattern->nativeIndexingLimit <= lVar9)) ||
         (0xdbff < (ushort)this->fRXPat->fPattern->chunkContents[lVar9])) {
        utext_setNativeIndex_63(this->fRXPat->fPattern,local_c8);
      }
      else {
        this->fRXPat->fPattern->chunkOffset = (int32_t)lVar9;
      }
    }
    this_local = (RegexCompile *)savedScanIndex;
    UnicodeString::~UnicodeString((UnicodeString *)local_98);
  }
  else {
    this_local = (RegexCompile *)0x0;
  }
  return (UnicodeSet *)this_local;
}

Assistant:

UnicodeSet *RegexCompile::scanPosixProp() {
    UnicodeSet    *uset = NULL;

    if (U_FAILURE(*fStatus)) {
        return NULL;
    }

    U_ASSERT(fC.fChar == chColon);

    // Save the scanner state.
    // TODO:  move this into the scanner, with the state encapsulated in some way.  Ticket 6062
    int64_t     savedScanIndex        = fScanIndex;
    int64_t     savedNextIndex        = UTEXT_GETNATIVEINDEX(fRXPat->fPattern);
    UBool       savedQuoteMode        = fQuoteMode;
    UBool       savedInBackslashQuote = fInBackslashQuote;
    UBool       savedEOLComments      = fEOLComments;
    int64_t     savedLineNum          = fLineNum;
    int64_t     savedCharNum          = fCharNum;
    UChar32     savedLastChar         = fLastChar;
    UChar32     savedPeekChar         = fPeekChar;
    RegexPatternChar savedfC          = fC;

    // Scan for a closing ].   A little tricky because there are some perverse
    //   edge cases possible.  "[:abc\Qdef:] \E]"  is a valid non-property expression,
    //   ending on the second closing ].

    UnicodeString propName;
    UBool         negated  = FALSE;

    // Check for and consume the '^' in a negated POSIX property, e.g.  [:^Letter:]
    nextChar(fC);
    if (fC.fChar == chUp) {
       negated = TRUE;
       nextChar(fC);
    }

    // Scan for the closing ":]", collecting the property name along the way.
    UBool  sawPropSetTerminator = FALSE;
    for (;;) {
        propName.append(fC.fChar);
        nextChar(fC);
        if (fC.fQuoted || fC.fChar == -1) {
            // Escaped characters or end of input - either says this isn't a [:Property:]
            break;
        }
        if (fC.fChar == chColon) {
            nextChar(fC);
            if (fC.fChar == chRBracket) {
                sawPropSetTerminator = TRUE;
            }
            break;
        }
    }

    if (sawPropSetTerminator) {
        uset = createSetForProperty(propName, negated);
    }
    else
    {
        // No closing ":]".
        //  Restore the original scan position.
        //  The main scanner will retry the input as a normal set expression,
        //    not a [:Property:] expression.
        fScanIndex        = savedScanIndex;
        fQuoteMode        = savedQuoteMode;
        fInBackslashQuote = savedInBackslashQuote;
        fEOLComments      = savedEOLComments;
        fLineNum          = savedLineNum;
        fCharNum          = savedCharNum;
        fLastChar         = savedLastChar;
        fPeekChar         = savedPeekChar;
        fC                = savedfC;
        UTEXT_SETNATIVEINDEX(fRXPat->fPattern, savedNextIndex);
    }
    return uset;
}